

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffdstr(fitsfile *fptr,char *string,int *status)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char local_228 [8];
  char nextcomm [73];
  char message [81];
  char local_178 [8];
  char card [81];
  char local_118 [8];
  char value [71];
  char local_c8 [8];
  char comm [73];
  char valstring [71];
  int len;
  int keypos;
  int *status_local;
  char *string_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar1 = ffgstr(fptr,string,local_178,status);
    if (iVar1 < 1) {
      iVar1 = (int)((fptr->Fptr->nextkey - fptr->Fptr->headstart[fptr->Fptr->curhdu]) / 0x50);
      ffdrec(fptr,iVar1,status);
      ffpsvc(local_178,comm + 0x48,local_c8,status);
      if (*status < 1) {
        ffpmrk();
        ffc2s(comm + 0x48,local_118,status);
        if (*status == 0xcc) {
          ffcmrk();
          *status = 0;
        }
        else {
          sVar2 = strlen(local_118);
          valstring._64_4_ = (undefined4)sVar2;
          while( true ) {
            bVar3 = false;
            if (valstring._64_4_ != 0) {
              bVar3 = local_118[valstring._64_4_ + -1] == '&';
            }
            if (!bVar3) break;
            ffgcnt(fptr,local_118,local_228,status);
            if (local_118[0] == '\0') {
              valstring[0x40] = '\0';
              valstring[0x41] = '\0';
              valstring[0x42] = '\0';
              valstring[0x43] = '\0';
            }
            else {
              ffdrec(fptr,iVar1,status);
              sVar2 = strlen(local_118);
              valstring._64_4_ = (undefined4)sVar2;
            }
          }
        }
        fptr_local._4_4_ = *status;
      }
      else {
        fptr_local._4_4_ = *status;
      }
    }
    else {
      snprintf(nextcomm + 0x48,0x51,"Could not find the %s keyword to delete (ffdkey)",string);
      ffpmsg(nextcomm + 0x48);
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffdstr(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *string,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword containing the input string
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char card[FLEN_CARD], message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgstr(fptr, string, card, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                string);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    /* check for string value which may be continued over multiple keywords */
    ffpsvc(card, valstring, comm, status);

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        ffgcnt(fptr, value, nextcomm, status);
        if (*value)
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}